

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int beagleSetDifferentialMatrix(int instance,int matrixIndex,double *inMatrix)

{
  BeagleImpl *pBVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  int returnValue;
  BeagleImpl *beagleInstance;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  pBVar1 = beagle::getBeagleInstance(in_stack_ffffffffffffffdc);
  if (pBVar1 == (BeagleImpl *)0x0) {
    local_4 = -4;
  }
  else {
    local_4 = (**(code **)(*(long *)pBVar1 + 0x90))(pBVar1,in_ESI,in_RDX);
  }
  return local_4;
}

Assistant:

int beagleSetDifferentialMatrix(int instance,
                                int matrixIndex,
                                const double* inMatrix) {
    DEBUG_START_TIME();

    beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
    if (beagleInstance == NULL)
        return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
    int returnValue = beagleInstance->setDifferentialMatrix(matrixIndex, inMatrix);
    DEBUG_END_TIME();
    return returnValue;
}